

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O3

int readFASTA(FILE *F,char *automatonState,StringBuffer *names,StringBuffer *sequences,
             Vector *nameLengths,Vector *seqLengths,long *firstSequenceLength,bool oneByOne,
             Vector *sequenceInstances,char sep,double include_prob,bool progress)

{
  StringBuffer *this;
  char cVar1;
  uint __c;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  unsigned_long uVar5;
  long lVar6;
  string *psVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  time_t after;
  time_t before;
  string err;
  ulong local_168;
  time_t local_150;
  time_t local_148;
  double local_140;
  char local_138 [264];
  
  if (oneByOne) {
    StringBuffer::resetString(sequences);
    StringBuffer::resetString(names);
    include_prob = 1.0;
  }
  uVar3 = (ulong)(include_prob * 4294967295.0);
  uVar10 = 0;
  if (include_prob < 1.0) {
    uVar10 = (long)(include_prob * 4294967295.0 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
             uVar3;
  }
  if (progress) {
    time(&local_148);
  }
  flockfile((FILE *)F);
  __c = getc_unlocked((FILE *)F);
  iVar2 = feof_unlocked((FILE *)F);
  if (iVar2 == 0) {
    bVar11 = true;
    local_168 = 0;
    do {
      cVar1 = *automatonState;
      if (cVar1 == '\x02') {
        iVar2 = toupper(__c);
        __c = (uint)(byte)validFlags[iVar2];
        this = sequences;
        if (validFlags[iVar2] < '\0') {
          if ((iVar2 == 0x3e) || (iVar2 == 0x23)) {
            *automatonState = '\x01';
            if (bVar11) {
              if (oneByOne) {
                if (*firstSequenceLength == 0) {
                  *firstSequenceLength = sequences->sLength - 1;
                }
                *automatonState = '\0';
                StringBuffer::appendChar(sequences,'\0');
                ungetc(iVar2,(FILE *)F);
                funlockfile((FILE *)F);
                return 2;
              }
              addASequenceToList(sequences,seqLengths,firstSequenceLength,names,nameLengths);
              local_168 = local_168 + 1;
              if ((progress) && ((local_168 & 0x3ff) == 0)) {
                time(&local_150);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                           ,0x5f);
                *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 8;
                poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," sequences read (",0x11);
                lVar6 = *(long *)poVar4;
                *(undefined8 *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x10) = 0xc;
                *(undefined8 *)(poVar4 + *(long *)(lVar6 + -0x18) + 8) = 3;
                local_140 = (double)(long)local_168;
                dVar12 = difftime(local_150,local_148);
                poVar4 = std::ostream::_M_insert<double>(local_140 / dVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," seqs/sec)",10);
                local_150 = local_148;
              }
            }
            bVar11 = true;
            goto LAB_00105d6c;
          }
        }
        else {
joined_r0x00105c23:
          if (bVar11) {
            StringBuffer::appendChar(this,(char)__c);
          }
        }
      }
      else if (cVar1 == '\x01') {
        if ((__c != 0xd) && (this = names, __c != 10)) goto joined_r0x00105c23;
        if (bVar11) {
          StringBuffer::appendChar(names,'\0');
          if (oneByOne) {
            uVar3 = names->sLength - 1;
          }
          else {
            Vector::appendValue(nameLengths,names->sLength);
            uVar3 = stringLength(nameLengths,nameLengths->vLength - 2);
          }
          if ((long)uVar3 < 1) {
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar7 = psVar7 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      (psVar7,"Sequence names must be non-empty.","");
            __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          *automatonState = '\x02';
          if (sequenceInstances != (Vector *)0x0) {
            lVar6 = 1;
            if (2 < uVar3) {
              lVar6 = 0;
              do {
                if (names->sData[lVar6 + (names->sLength - 3)] == sep) {
                  iVar2 = atoi(names->sData + lVar6 + names->sLength + -2);
                  lVar6 = (long)iVar2;
                  goto LAB_00105e41;
                }
                lVar6 = lVar6 + -1;
              } while (2 - uVar3 != lVar6);
              lVar6 = 1;
LAB_00105e41:
              lVar6 = lVar6 + (ulong)(lVar6 == 0);
              if (include_prob < 1.0) {
                lVar9 = 0;
                do {
                  uVar5 = genrand_int32();
                  lVar9 = lVar9 + (ulong)(uVar5 < uVar10);
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
                lVar6 = lVar9;
                if (lVar9 == 0) {
                  if (oneByOne) {
                    StringBuffer::resetString(names);
                  }
                  else {
                    uVar3 = Vector::value(nameLengths,nameLengths->vLength - 2);
                    if (uVar3 < names->sLength) {
                      names->sLength = uVar3;
                    }
                  }
                  Vector::remove(nameLengths,(char *)(nameLengths->vLength - 1));
                  bVar11 = false;
                  goto LAB_00105eb2;
                }
              }
            }
            if (oneByOne) {
              Vector::resetVector(sequenceInstances);
            }
            Vector::appendValue(sequenceInstances,lVar6);
          }
        }
      }
      else if ((cVar1 == '\0') && ((__c == 0x3e || (__c == 0x23)))) {
        *automatonState = '\x01';
LAB_00105d6c:
        if (sequenceInstances == (Vector *)0x0 && include_prob < 1.0) {
          uVar5 = genrand_int32();
          bVar11 = uVar5 < uVar10;
        }
      }
LAB_00105eb2:
      __c = getc_unlocked((FILE *)F);
      iVar2 = feof_unlocked((FILE *)F);
    } while (iVar2 == 0);
    cVar1 = *automatonState;
    if ((cVar1 != '\0' || !oneByOne) && cVar1 != '\x02') goto LAB_00105ff1;
    if (!bVar11) goto LAB_00105f92;
  }
  else {
    cVar1 = *automatonState;
    if ((cVar1 != '\0' || !oneByOne) && cVar1 != '\x02') {
LAB_00105ff1:
      snprintf(local_138,0xff,"Unexpected end of file: state %d",(ulong)(uint)(int)cVar1);
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar7 = psVar7 + 0x10;
      sVar8 = strlen(local_138);
      std::__cxx11::string::_M_construct<char_const*>(psVar7,local_138,local_138 + sVar8);
      __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  if (oneByOne) {
    if (*firstSequenceLength == 0) {
      *firstSequenceLength = sequences->sLength - 1;
    }
    *automatonState = '\0';
    StringBuffer::appendChar(sequences,'\0');
    funlockfile((FILE *)F);
    return 3;
  }
  addASequenceToList(sequences,seqLengths,firstSequenceLength,names,nameLengths);
LAB_00105f92:
  *automatonState = '\x01';
  return 0;
}

Assistant:

int readFASTA (FILE* F, char& automatonState,  StringBuffer &names, 
               StringBuffer& sequences, Vector &nameLengths, Vector &seqLengths, 
               long& firstSequenceLength, bool oneByOne, 
               Vector* sequenceInstances, char sep,
               double include_prob, bool progress) {
  
  unsigned long up_to = 0L;
  
  if (oneByOne) {
    sequences.resetString();
    names.resetString();
    include_prob = 1.;
  }
  
  if (include_prob < 1.) {
    up_to = RAND_RANGE * include_prob;
  }
    
  time_t before, after;
  if (progress) {
    time(&before);
  }

  
  bool include_me = true;
  long read_counter = 0;
    
  flockfile(F);
    
  try {
  
      while (1) {
        int currentC = getc_unlocked (F);
          //cout << "State: " << int(automatonState) << "/'" << char(currentC) << "'" << endl;
        if (feof_unlocked (F))
          break;
          
        switch (automatonState) {
          case 0: {
            if (currentC == '>' || currentC == '#') {
              automatonState = 1;
              if (sequenceInstances == NULL && include_prob < 1.) {
                include_me = genrand_int32() < up_to;
              }
            }
            break;
          }
          case 1: {
            if (currentC == '\n' || currentC == '\r') {
              if (include_me) {
                  names.appendChar   ('\0');
     
                long this_name_l;
                if (oneByOne) {
                  this_name_l = names.length ()-1;
                  
                } else {
                  nameLengths.appendValue (names.length());
                  this_name_l = stringLength (nameLengths, nameLengths.length()-2);
                }

                
                if (this_name_l <= 0) {
                  throw std::string("Sequence names must be non-empty.");
                }
                automatonState = 2;

                if (sequenceInstances) {
                    unsigned long count = 1L;
                   if (this_name_l >= 3) {
                      long sep_loc = 0, ll = names.length();
                      for (sep_loc = 2; sep_loc < this_name_l; sep_loc ++) {
                        if (names.getChar(ll-sep_loc-1) == sep) {
                          break;
                        }
                      }
                      if (sep_loc < this_name_l) {
                        count = atoi (names.getString() + (ll-sep_loc));
                      }
                      if (count < 1) {
                        count = 1;
                      }
                      
                      unsigned long resampled_prob = 0UL;
                      
                      if (include_prob < 1.) {
                        for (long k = 0; k < count; k ++) {
                          resampled_prob += genrand_int32() < up_to;
                        }
                      } else {
                        resampled_prob = count;
                      }
                     
                     //cerr << count << " -> " << resampled_prob << endl;
                     
                      if (resampled_prob == 0UL) {
                        if (oneByOne) {
                          names.resetString();
                        } else {
                          names.reset_length (nameLengths.value (nameLengths.length()-2));
                        }
                        nameLengths.remove(nameLengths.length()-1);
                        include_me = false;
                        continue;
                      } else {
                        count = resampled_prob;
                      }
                      
                    }
                    if (oneByOne) {
                      sequenceInstances->resetVector();
                    }
                    sequenceInstances->appendValue(count);
                  }
               }
              
                
            }
            else {
              if (include_me) {
                names.appendChar(currentC);
              }
            }
            break;
          }
          case 2: {
            currentC = toupper (currentC);
            if (validFlags [currentC] >= 0) {
              if (include_me)
                //cout << "Append " << currentC << endl;
                sequences.appendChar (validFlags [currentC]);
            }
            else {
              if (currentC == '>' || currentC == '#') {
                automatonState = 1;
                if (include_me) {
                  if (oneByOne) {
                    if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                    }
                      //cerr << endl << "Returning a sequence" << endl;
                    automatonState = 0;
                    sequences.appendChar ('\0');
                    ungetc (currentC, F);
                    funlockfile (F);
                    return 2;
                  }
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
                  read_counter++;
                  if (progress && read_counter % 1024 == 0) {
                      time(&after);
                      cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                              ":"
                           << setw(8) << read_counter << " sequences read (" << setw(12) << std::setprecision(3)
                           << read_counter / difftime(after, before) << " seqs/sec)";

                      after = before;
                  }
                }
                if (sequenceInstances == NULL && include_prob < 1.) {
                  include_me = genrand_int32() < up_to;
                } else {
                  include_me = true;
                }
                  
              }
            }
            break;
          }
        }
      }
      
      if (automatonState == 2 || (oneByOne && automatonState == 0)) {
          if (include_me) {
              if (oneByOne) {
                  if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                  }
                  automatonState = 0;
                  sequences.appendChar ('\0');
                  funlockfile (F);
                  return 3;
              } else {
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
              }
          }
          automatonState = 1;
      } else {
        char err[256] ;
        snprintf (err, 255, "Unexpected end of file: state %d", automatonState);
        throw std::string(err);
      }
  } catch (std::string const err) {
      cerr << err << endl;
      funlockfile (F);
      return 1;
  }
  return 0;
}